

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereSurface.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  Rectangular *this;
  Spherical *this_00;
  BoxProjection *this_01;
  YinYang *this_02;
  TwoCaps *this_03;
  undefined1 local_4b0 [8];
  ofstream outfile;
  string local_2b0 [32];
  undefined1 local_290 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [8];
  string fileName;
  stringstream local_1e8 [8];
  stringstream ss;
  ostream local_1d8 [376];
  undefined1 local_60 [56];
  int c;
  int coordinates;
  double radius;
  Parameterization *param;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _c = 0.5;
  local_60._52_4_ = 1;
  param = (Parameterization *)argv;
  argv_local._0_4_ = argc;
  while( true ) {
    local_60._48_4_ = getopt((int)argv_local,(char **)param,"r:p:");
    if (local_60._48_4_ == -1) {
      switch(local_60._52_4_) {
      case 0:
        this = (Rectangular *)operator_new(0xb0);
        Rectangular::Rectangular(this,_c);
        radius = (double)this;
        break;
      case 1:
        this_00 = (Spherical *)operator_new(0xf0);
        Spherical::Spherical(this_00,_c);
        radius = (double)this_00;
        break;
      case 2:
        this_01 = (BoxProjection *)operator_new(0xb0);
        BoxProjection::BoxProjection(this_01,_c);
        radius = (double)this_01;
        break;
      case 3:
        this_02 = (YinYang *)operator_new(0xf0);
        YinYang::YinYang(this_02,_c);
        radius = (double)this_02;
        break;
      case 4:
        this_03 = (TwoCaps *)operator_new(0x138);
        TwoCaps::TwoCaps(this_03,_c);
        radius = (double)this_03;
      }
      std::operator<<((ostream *)&std::cout,">>> Starting SphereSurface <<<\n");
      poVar3 = std::operator<<((ostream *)&std::cout,"Sphere Radius = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)((long)radius + 0x28));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Using Parameterization = ");
      Parameterization::GetName_abi_cxx11_((Parameterization *)local_60);
      poVar3 = std::operator<<(poVar3,(string *)local_60);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::stringstream::stringstream(local_1e8);
      poVar3 = (ostream *)std::ostream::operator<<(local_1d8,std::fixed);
      _Var2 = std::setprecision(2);
      poVar3 = std::operator<<(poVar3,_Var2);
      std::ostream::operator<<(poVar3,*(double *)((long)radius + 0x28));
      Parameterization::GetName_abi_cxx11_((Parameterization *)local_290);
      std::operator+(local_290 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "SphereSurf-");
      std::operator+(local_250,local_290 + 0x20);
      std::__cxx11::stringstream::str();
      std::operator+(local_230,local_250);
      std::operator+(local_210,(char *)local_230);
      std::__cxx11::string::~string((string *)local_230);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::string::~string((string *)(local_290 + 0x20));
      std::__cxx11::string::~string((string *)local_290);
      std::ofstream::ofstream(local_4b0);
      std::ofstream::open(local_4b0,local_210,0x10);
      (**(code **)(*(long *)radius + 8))(radius,local_4b0);
      std::ofstream::close();
      std::operator<<((ostream *)&std::cout,"\n>>> SphereSurface Mesh File Complete <<<\n");
      argv_local._4_4_ = 0;
      std::ofstream::~ofstream(local_4b0);
      std::__cxx11::string::~string((string *)local_210);
      std::__cxx11::stringstream::~stringstream(local_1e8);
      return argv_local._4_4_;
    }
    if (local_60._48_4_ == 0x3f) break;
    if (local_60._48_4_ == 0x70) {
      local_60._52_4_ = atoi(_optarg);
    }
    else {
      if (local_60._48_4_ != 0x72) {
        abort();
      }
      _c = strtod(_optarg,(char **)0x0);
    }
  }
  if (_optopt == 99) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Option -");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,_optopt);
    poVar3 = std::operator<<(poVar3," requires an argument.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar1 = isprint(_optopt);
    if (iVar1 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Unknown option character ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,_optopt);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Unknown option -");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,_optopt);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
  Parameterization* param;
  double radius = 0.5e0;
  int coordinates = SPHERICAL;
  int c;

  // Parsing command line arguments with getopt
  while ((c = getopt(argc, argv, "r:p:")) != -1) {
    switch (c) {
      case 'r':
        radius = strtod(optarg, NULL);
        break;
      case 'p':
        coordinates = atoi(optarg);
        break;
      case '?':
        if (optopt == 'c')
          cout << "Option -" << optopt << " requires an argument." << endl;
        else if (isprint (optopt))
          cout << "Unknown option -" << optopt << endl;
        else
          cout << "Unknown option character " << optopt << endl;
        return 1;
      default:
        abort();
    }
  }

  switch (coordinates) {
    case RECTANGULAR:
      param = new Rectangular(radius);
      break;
    case SPHERICAL:
      param = new Spherical(radius);
      break;
    case BOX_PROJECTION:
      param = new BoxProjection(radius);
      break;
    case YIN_YANG:
      param = new YinYang(radius);
      break;
    case TWO_CAPS:
      param = new TwoCaps(radius);
      break;
  }

  // Initial log to console.
  cout << ">>> Starting SphereSurface <<<\n";
  cout << "Sphere Radius = " << param->radius << endl;
  cout << "Using Parameterization = " << param->GetName() << endl;


  // Open file to write.
  stringstream ss;
  ss << fixed << setprecision(2) << param->radius;
  string fileName = "SphereSurf-" + param->GetName() + "-r" + ss.str() + ".xyz";
  ofstream outfile;
  outfile.open(fileName);

  param->PrintPlot3D(outfile);

  outfile.close();

  cout << "\n>>> SphereSurface Mesh File Complete <<<\n";

  return 0;
}